

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Composition.cpp
# Opt level: O0

void __thiscall Composition::Repair(Composition *this)

{
  int breakCount;
  int *breaks;
  undefined8 uStack_28;
  int componentCount;
  Coord *shrinkability;
  Coord *stretchability;
  Coord *natural;
  Composition *this_local;
  
  (**this->_compositor->_vptr_Compositor)
            (this->_compositor,stretchability,shrinkability,uStack_28,(ulong)breaks._4_4_,
             (ulong)(uint)this->_lineWidth);
  return;
}

Assistant:

void Composition::Repair() {
    Coord* natural;
    Coord* stretchability;
    Coord* shrinkability;
    int componentCount;
    int* breaks;

    // prepare the arrays with the desired component sizes
    // ...

    // determine where the breaks are:
    int breakCount;
    breakCount = _compositor->Compose(
        natural, stretchability, shrinkability,
        componentCount, _lineWidth, breaks
    );

    // lay out components according to breaks
    // ...
}